

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.hpp
# Opt level: O2

unsigned_short
duckdb::AddOperatorOverflowCheck::Operation<unsigned_short,unsigned_short,unsigned_short>
          (unsigned_short left,unsigned_short right)

{
  uint uVar1;
  OutOfRangeException *this;
  PhysicalType type;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  uVar1 = (int)CONCAT62(in_register_00000032,right) + (int)CONCAT62(in_register_0000003a,left);
  if (uVar1 < 0x10000) {
    return (unsigned_short)uVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Overflow in addition of %s (%s + %s)!",&local_a1);
  TypeIdToString_abi_cxx11_(&local_60,(duckdb *)0x4,type);
  NumericHelper::ToString<unsigned_short>(&local_80,left);
  NumericHelper::ToString<unsigned_short>(&local_a0,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_40,&local_60,&local_80,&local_a0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryAddOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in addition of %s (%s + %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}